

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<int,_unsigned_int,_7>::Addition(int *lhs,uint *rhs,int *result)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  undefined4 *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI + (ulong)*in_RSI;
  if (!SCARRY8((long)*in_RDI,(ulong)*in_RSI)) {
    iVar2 = std::numeric_limits<int>::max();
    if (lVar3 <= iVar2) {
      *in_RDX = (int)lVar3;
    }
    return lVar3 <= iVar2;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // 32-bit or less - lhs signed, rhs unsigned
        std::int64_t tmp = (std::int64_t)lhs + (std::int64_t)rhs;

        if( tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }